

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

double computeTN93(char *s1,char *s2,unsigned_long L,char matchMode,long *randomize,long min_overlap
                  ,unsigned_long *histogram,double slice,unsigned_long hist_size,long count1,
                  long count2,sequence_gap_structure *sequence_descriptor1,
                  sequence_gap_structure *sequence_descriptor2)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long (*palVar7) [4];
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  double (*padVar18) [4];
  long (*palVar19) [4];
  double dVar20;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  long *plVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char *pcVar30;
  char *in_XMM8_Qa;
  double in_XMM8_Qb;
  long alStackY_15b8 [16];
  long alStackY_1538 [588];
  char matchMode_local;
  char *local_298;
  long *local_290;
  double local_288;
  undefined8 uStack_280;
  char *local_278;
  double dStack_270;
  double local_268;
  ulong uStack_260;
  uint local_24c;
  undefined1 local_248 [24];
  double local_230;
  anon_class_32_4_32a09f7f ambiguityHandler;
  double nucFreq [4];
  unsigned_long ambig_count;
  double nucF [4];
  long integer_counts2 [4] [4];
  long integer_counts [4] [4];
  double float_counts [4] [4];
  
  local_230 = slice;
  ambig_count = 0;
  matchMode_local = matchMode;
  nucFreq[2] = 0.0;
  nucFreq[3] = 0.0;
  nucFreq[0] = 0.0;
  nucFreq[1] = 0.0;
  padVar18 = float_counts;
  float_counts[3][2] = 0.0;
  float_counts[3][3] = 0.0;
  float_counts[3][0] = 0.0;
  float_counts[3][1] = 0.0;
  float_counts[2][2] = 0.0;
  float_counts[2][3] = 0.0;
  float_counts[2][0] = 0.0;
  float_counts[2][1] = 0.0;
  float_counts[1][2] = 0.0;
  float_counts[1][3] = 0.0;
  float_counts[1][0] = 0.0;
  float_counts[1][1] = 0.0;
  float_counts[0][2] = 0.0;
  float_counts[0][3] = 0.0;
  float_counts[0][0] = 0.0;
  float_counts[0][1] = 0.0;
  palVar19 = integer_counts;
  integer_counts[3][2] = 0;
  integer_counts[3][3] = 0;
  integer_counts[3][0] = 0;
  integer_counts[3][1] = 0;
  integer_counts[2][2] = 0;
  integer_counts[2][3] = 0;
  integer_counts[2][0] = 0;
  integer_counts[2][1] = 0;
  integer_counts[1][2] = 0;
  integer_counts[1][3] = 0;
  integer_counts[1][0] = 0;
  integer_counts[1][1] = 0;
  integer_counts[0][2] = 0;
  integer_counts[0][3] = 0;
  integer_counts[0][0] = 0;
  integer_counts[0][1] = 0;
  integer_counts2[3][2] = 0;
  integer_counts2[3][3] = 0;
  integer_counts2[3][0] = 0;
  integer_counts2[3][1] = 0;
  integer_counts2[2][2] = 0;
  integer_counts2[2][3] = 0;
  integer_counts2[2][0] = 0;
  integer_counts2[2][1] = 0;
  integer_counts2[1][2] = 0;
  integer_counts2[1][3] = 0;
  integer_counts2[1][0] = 0;
  integer_counts2[1][1] = 0;
  integer_counts2[0][2] = 0;
  integer_counts2[0][3] = 0;
  integer_counts2[0][0] = 0;
  integer_counts2[0][1] = 0;
  ambiguityHandler.matchMode = &matchMode_local;
  ambiguityHandler.ambig_count = &ambig_count;
  ambiguityHandler.integer_counts = &palVar19;
  ambiguityHandler.float_counts = &padVar18;
  uVar14 = 0xf;
  if (randomize == (long *)0x0) {
    if (((matchMode == '\x03') || (sequence_descriptor1 == (sequence_gap_structure *)0x0)) ||
       (sequence_descriptor2 == (sequence_gap_structure *)0x0)) {
      for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < L; uVar15 = uVar15 + 1) {
        cVar1 = s1[uVar16];
        uVar12 = (uint)cVar1;
        bVar2 = s2[uVar16];
        uVar10 = (uint)(char)bVar2;
        if ((uVar12 < 4) && (bVar2 < 4)) {
          integer_counts[uVar12][uVar10] = integer_counts[uVar12][uVar10] + 1;
        }
        else {
          uVar13 = uVar12;
          if (bVar2 == 0x11 || cVar1 == '\x11') {
            if ((matchMode_local != '\x03') || (cVar1 == '\x11' && bVar2 == 0x11))
            goto LAB_001047a2;
            uVar13 = uVar14;
            if (cVar1 != '\x11') {
              uVar13 = uVar12;
              uVar10 = uVar14;
            }
          }
          local_298 = s2;
          local_290 = randomize;
          local_288 = (double)L;
          local_268 = (double)min_overlap;
          computeTN93::anon_class_32_4_32a09f7f::operator()(&ambiguityHandler,uVar13,uVar10);
          randomize = local_290;
          min_overlap = (long)local_268;
          s2 = local_298;
          L = (unsigned_long)local_288;
        }
LAB_001047a2:
      }
    }
    else {
      local_268 = (double)min_overlap;
      uVar16 = sequence_descriptor2->first_nongap;
      if (sequence_descriptor2->first_nongap < sequence_descriptor1->first_nongap) {
        uVar16 = sequence_descriptor1->first_nongap;
      }
      dVar20 = (double)sequence_descriptor2->last_nongap;
      if (sequence_descriptor1->last_nongap < sequence_descriptor2->last_nongap) {
        dVar20 = (double)sequence_descriptor1->last_nongap;
      }
      uVar17 = sequence_descriptor2->resolved_start;
      if (sequence_descriptor2->resolved_start < sequence_descriptor1->resolved_start) {
        uVar17 = sequence_descriptor1->resolved_start;
      }
      uVar8 = sequence_descriptor2->resolved_end;
      if (sequence_descriptor1->resolved_end < sequence_descriptor2->resolved_end) {
        uVar8 = sequence_descriptor1->resolved_end;
      }
      local_248._0_8_ = uVar8;
      local_288 = dVar20;
      if (uVar8 < uVar17) {
        local_298 = s2;
        local_278 = s1;
        for (; uVar17 = uVar16 & 0xffffffff, uVar17 <= (ulong)dVar20;
            uVar16 = (ulong)((int)uVar16 + 1)) {
          uVar14 = (uint)s1[uVar17];
          bVar2 = s2[uVar17];
          if (bVar2 < 4 && uVar14 < 4) {
            integer_counts[uVar14][(uint)(int)(char)bVar2] =
                 integer_counts[uVar14][(uint)(int)(char)bVar2] + 1;
          }
          else if (bVar2 != 0x11 && s1[uVar17] != '\x11') {
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      (&ambiguityHandler,uVar14,(int)(char)bVar2);
            dVar20 = local_288;
            s1 = local_278;
            s2 = local_298;
          }
        }
      }
      else {
        while( true ) {
          uVar8 = uVar16 + 2;
          if (uVar17 < uVar8) break;
          uVar15 = (uint)s1[uVar16];
          bVar2 = s2[uVar16];
          bVar3 = s1[uVar16 + 1];
          uVar14 = (uint)s2[uVar16 + 1];
          if ((uVar15 < 4) && (bVar2 < 4)) {
            integer_counts[uVar15][(uint)(int)(char)bVar2] =
                 integer_counts[uVar15][(uint)(int)(char)bVar2] + 1;
          }
          else if (bVar2 != 0x11 && s1[uVar16] != '\x11') {
            local_298 = s2;
            local_290 = randomize;
            local_278 = s1;
            local_24c = uVar14;
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      (&ambiguityHandler,uVar15,(int)(char)bVar2);
            s1 = local_278;
            randomize = local_290;
            s2 = local_298;
            uVar14 = local_24c;
          }
          uVar16 = uVar8;
          if ((bVar3 < 4) && ((byte)uVar14 < 4)) {
            integer_counts2[(uint)(int)(char)bVar3][uVar14] =
                 integer_counts2[(uint)(int)(char)bVar3][uVar14] + 1;
          }
          else if ((bVar3 != 0x11) && ((byte)uVar14 != 0x11)) {
            local_298 = s2;
            local_290 = randomize;
            local_278 = s1;
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      (&ambiguityHandler,(int)(char)bVar3,uVar14);
            s1 = local_278;
            randomize = local_290;
            s2 = local_298;
          }
        }
        if (uVar16 < uVar17) {
          uVar14 = (uint)s1[uVar16];
          bVar2 = s2[uVar16];
          if ((uVar14 < 4) && (bVar2 < 4)) {
            integer_counts[uVar14][(uint)(int)(char)bVar2] =
                 integer_counts[uVar14][(uint)(int)(char)bVar2] + 1;
          }
          else if (bVar2 != 0x11 && s1[uVar16] != '\x11') {
            local_278 = s1;
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      (&ambiguityHandler,uVar14,(int)(char)bVar2);
            s1 = local_278;
          }
        }
        dVar20 = local_288;
        uVar16 = local_248._0_8_;
        while (min_overlap = (long)local_268, uVar17 + 2 <= uVar16) {
          integer_counts[s1[uVar17]][s2[uVar17]] = integer_counts[s1[uVar17]][s2[uVar17]] + 1;
          integer_counts2[s1[uVar17 + 1]][s2[uVar17 + 1]] =
               integer_counts2[s1[uVar17 + 1]][s2[uVar17 + 1]] + 1;
          uVar17 = uVar17 + 2;
        }
        for (; uVar17 <= uVar16; uVar17 = uVar17 + 1) {
          integer_counts[(uint)(int)s1[uVar17]][(uint)(int)s2[uVar17]] =
               integer_counts[(uint)(int)s1[uVar17]][(uint)(int)s2[uVar17]] + 1;
        }
        while (uVar16 = uVar16 + 1, uVar16 <= (ulong)dVar20) {
          uVar14 = (uint)s1[uVar16];
          bVar2 = s2[uVar16];
          if ((uVar14 < 4) && (bVar2 < 4)) {
            integer_counts[uVar14][(uint)(int)(char)bVar2] =
                 integer_counts[uVar14][(uint)(int)(char)bVar2] + 1;
          }
          else if (bVar2 != 0x11 && s1[uVar16] != '\x11') {
            local_248._0_8_ = uVar16;
            local_290 = randomize;
            local_278 = s1;
            computeTN93::anon_class_32_4_32a09f7f::operator()
                      (&ambiguityHandler,uVar14,(int)(char)bVar2);
            dVar20 = local_288;
            s1 = local_278;
            randomize = local_290;
            uVar16 = local_248._0_8_;
          }
        }
      }
    }
  }
  else {
    for (uVar15 = 0; uVar15 < L; uVar15 = uVar15 + 1) {
      cVar1 = s1[randomize[uVar15]];
      uVar12 = (uint)cVar1;
      bVar2 = s2[randomize[uVar15]];
      uVar10 = (uint)(char)bVar2;
      if ((uVar12 < 4) && (bVar2 < 4)) {
        integer_counts[uVar12][uVar10] = integer_counts[uVar12][uVar10] + 1;
      }
      else {
        uVar13 = uVar12;
        if (bVar2 == 0x11 || cVar1 == '\x11') {
          if ((matchMode_local != '\x03') || (cVar1 == '\x11' && bVar2 == 0x11)) goto LAB_001045b9;
          uVar13 = uVar14;
          if (cVar1 != '\x11') {
            uVar13 = uVar12;
            uVar10 = uVar14;
          }
        }
        local_298 = s2;
        local_290 = randomize;
        local_288 = (double)L;
        local_268 = (double)min_overlap;
        computeTN93::anon_class_32_4_32a09f7f::operator()(&ambiguityHandler,uVar13,uVar10);
        randomize = local_290;
        min_overlap = (long)local_268;
        s2 = local_298;
        L = (unsigned_long)local_288;
      }
LAB_001045b9:
    }
  }
  dVar20 = 0.0;
  palVar7 = integer_counts2;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      dVar21 = (double)((*palVar7)[lVar11] + (*(long (*) [4])*palVar19)[lVar11]) +
               (*(double (*) [4])*padVar18)[lVar11];
      (*(double (*) [4])*padVar18)[lVar11] = dVar21;
      dVar20 = dVar20 + dVar21;
      nucFreq[lVar9] = nucFreq[lVar9] + dVar21;
      nucFreq[lVar11] = dVar21 + nucFreq[lVar11];
    }
    palVar19 = palVar19 + 1;
    palVar7 = palVar7 + 1;
    padVar18 = padVar18 + 1;
  }
  if (dVar20 <= (double)min_overlap) {
    local_288 = -1.0;
  }
  else if ((((matchMode_local & 0xfbU) != 0) || (1.0 <= resolve_fraction)) ||
          (auVar29._0_8_ = (double)CONCAT44(0x43300000,(int)ambig_count),
          auVar29._8_4_ = (int)(ambig_count >> 0x20), auVar29._12_4_ = 0x45300000,
          (auVar29._8_8_ - 1.9342813113834067e+25) + (auVar29._0_8_ - 4503599627370496.0) <
          dVar20 * resolve_fraction)) {
    dVar20 = nucFreq[3] + nucFreq[1] + nucFreq[0] + nucFreq[2];
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      nucF[lVar9] = nucFreq[lVar9] * (1.0 / dVar20);
    }
    dVar20 = 2.0 / dVar20;
    dVar21 = nucF[0] + nucF[2];
    dVar22 = nucF[1] + nucF[3];
    auVar29 = ZEXT816(0);
    auVar24._4_4_ = -(uint)(nucFreq[1] == 0.0);
    auVar24._0_4_ = -(uint)(nucFreq[0] == 0.0);
    auVar24._8_4_ = -(uint)(nucFreq[2] == 0.0);
    auVar24._12_4_ = -(uint)(nucFreq[3] == 0.0);
    iVar6 = movmskps(4,auVar24);
    if (iVar6 == 0) {
      auVar28._0_8_ = (nucF[0] + nucF[0]) * nucF[2];
      auVar28._8_8_ = (nucF[1] + nucF[1]) * nucF[3];
      auVar4._8_8_ = dVar22;
      auVar4._0_8_ = dVar21;
      auVar29 = divpd(auVar28,auVar4);
      dVar25 = (dVar21 * dVar22 - (nucF[2] * nucF[0] * dVar22) / dVar21) -
               (nucF[1] * nucF[3] * dVar21) / dVar22;
      in_XMM8_Qa = (char *)(dVar25 + dVar25);
      in_XMM8_Qb = dVar22;
    }
    dVar25 = (float_counts[0][2] + float_counts[2][0]) * dVar20;
    auVar23._0_8_ = (float_counts[1][3] + float_counts[3][1]) * dVar20;
    dVar20 = 1.0 - ((float_counts[0][0] + float_counts[1][1] + float_counts[2][2] +
                    float_counts[3][3]) * dVar20 + dVar25 + auVar23._0_8_);
    if ((char)iVar6 == '\0') {
      dVar25 = (1.0 - dVar25 / auVar29._0_8_) - (dVar20 * 0.5) / dVar21;
      dVar27 = 1000.0;
      uStack_280 = 0;
      if (0.0 < dVar25) {
        auVar23._8_8_ = dVar20 * 0.5;
        auVar5._8_8_ = dVar22;
        auVar5._0_8_ = auVar29._8_8_;
        auVar24 = divpd(auVar23,auVar5);
        plVar26 = (long *)((1.0 - auVar24._0_8_) - auVar24._8_8_);
        if ((0.0 < (double)plVar26) &&
           (pcVar30 = (char *)(1.0 - auVar24._8_8_ / dVar21), 0.0 < (double)pcVar30)) {
          local_268 = -auVar29._0_8_;
          uStack_260 = auVar29._8_8_ ^ 0x8000000000000000;
          local_298 = pcVar30;
          local_290 = plVar26;
          local_278 = in_XMM8_Qa;
          dStack_270 = in_XMM8_Qb;
          local_248._0_16_ = auVar29;
          local_288 = log(dVar25);
          uStack_280 = extraout_XMM0_Qb_00;
          dVar20 = log((double)local_290);
          local_288 = local_288 * local_268 - (double)local_248._8_8_ * dVar20;
          dVar20 = log((double)local_298);
          dVar27 = local_288 - (double)local_278 * dVar20;
        }
      }
    }
    else {
      dVar21 = (1.0 - (dVar25 + auVar23._0_8_ + dVar25 + auVar23._0_8_)) - dVar20;
      dVar27 = 1000.0;
      uStack_280 = 0;
      if ((0.0 < dVar21) && (pcVar30 = (char *)(1.0 - (dVar20 + dVar20)), 0.0 < (double)pcVar30)) {
        local_298 = pcVar30;
        local_288 = log(dVar21);
        uStack_280 = extraout_XMM0_Qb;
        dVar20 = log((double)local_298);
        dVar27 = local_288 * -0.5 + dVar20 * -0.25;
      }
    }
    local_288 = dVar27;
    if (histogram != (unsigned_long *)0x0) {
      dVar20 = floor(local_230 * dVar27);
      uVar16 = hist_size - 1;
      if ((ulong)(long)dVar20 < hist_size) {
        uVar16 = (long)dVar20;
      }
      histogram[uVar16] = histogram[uVar16] + count2 * count1;
    }
    local_288 = (double)(~-(ulong)(local_288 <= 0.0) & (ulong)local_288);
  }
  else {
    local_288 = computeTN93(s1,s2,L,'\x01',randomize,min_overlap,histogram,local_230,hist_size,
                            count1,count2,(sequence_gap_structure *)0x0,
                            (sequence_gap_structure *)0x0);
  }
  return local_288;
}

Assistant:

double		computeTN93 (const char * __restrict__ s1, const char * __restrict__ s2,  const unsigned long L, const char matchMode, const long * randomize, const long min_overlap,
                       unsigned long* histogram, const double slice, const unsigned long hist_size, const long count1, const long count2, const sequence_gap_structure * sequence_descriptor1, const sequence_gap_structure * sequence_descriptor2) {
  
  bool useK2P   = false;
  unsigned long ambig_count = 0UL;
  long aux1;
    
  
  double auxd,
  nucFreq[4]		= {0.,0.,0.,0.},
  fY,
  fR,
  K1,
  K2,
  K3,
  AG,
  CT,
  ti,
  tv,
  totalNonGap	= 0.,
  nucF[4],
  float_counts [4][4] = {{0.},{0.},{0.},{0.}};
  
  long integer_counts  [4][4] = {{0L}, {0L}, {0L}, {0L}};
  long integer_counts2 [4][4] = {{0L}, {0L}, {0L}, {0L}};

  auto ambiguityHandler = [&] (unsigned c1, unsigned c2) -> void {
      if (c1 < 4UL) { // c1 resolved and c2 is not
        if (matchMode != SKIP) {
          if (resolutionsCount[c2] > 0.) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c2])) {
                  if (resolutions[c2][c1]) {
                      ambig_count ++;
                      integer_counts[c1][c1] ++;
                      return;
                  }
              }
            
            if (resolutions[c2][0])
              float_counts[c1][0] += resolutionsCount[c2];
            if (resolutions[c2][1])
              float_counts[c1][1] += resolutionsCount[c2];
            if (resolutions[c2][2])
              float_counts[c1][2] += resolutionsCount[c2];
            if (resolutions[c2][3])
              float_counts[c1][3] += resolutionsCount[c2];
          }
        }
      }
      else {
        if (matchMode != SKIP) {
          if (c2 < 4UL) { // c2 resolved an c1 is not
            if (resolutionsCount[c1] > 0.) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c1])) {
                if (resolutions[c1][c2]) {
                  ambig_count ++;
                  integer_counts[c2][c2] ++;
                    return;
                }
              }
              
                
              if (resolutions[c1][0])
                float_counts[0][c2] += resolutionsCount[c1];
              if (resolutions[c1][1])
                float_counts[1][c2] += resolutionsCount[c1];
              if (resolutions[c1][2])
                float_counts[2][c2] += resolutionsCount[c1];
              if (resolutions[c1][3])
                float_counts[3][c2] += resolutionsCount[c1];
            }
          } else {
            // ambig and ambig
            double norm = resolutionsCount[c1] * resolutionsCount[c2];
            //cout << int(c1) << ":" << int(c2) << "/" << norm << endl;
            if (norm > 0.0) {
              if (matchMode == RESOLVE || (matchMode == SUBSET && resolveTheseAmbigs[c1] && resolveTheseAmbigs[c2])) {
                ambig_count ++;
                long matched_count = 0L,
                positive_match [4] = {0,0,0,0};
                for (long i = 0; i < 4L; i ++) {
                  if (resolutions[c1][i] && resolutions[c2][i]) {
                    matched_count ++;
                    positive_match[i] = 1;
                  }
                }
                
                if (matched_count > 0L) {
                  double norm2 = 1./matched_count;
                  
                  for (long i = 0; i < 4L; i ++) {
                    if (positive_match[i]) {
                      float_counts[i][i] += norm2;
                    }
                  }
                    return;
                }
              }
              
              for (long i = 0; i < 4L; i ++) {
                if (resolutions[c1][i]) {
                  for (long j = 0; j < 4L; j ++) {
                    if (resolutions [c2][j]) {
                      float_counts[i][j] += norm;
                    }
                  }
                }
              }
            }
          }
        }
      }
  };

  if (randomize == NULL) {
    
    if (sequence_descriptor1 && sequence_descriptor2 && matchMode != GAPMM) {
      
      
//#pragma omp critical      
//      cout << "HERE" << endl;
     
      
      unsigned long first_nongap = MAX  (sequence_descriptor1->first_nongap,   sequence_descriptor2->first_nongap),
                    last_nongap  = MIN  (sequence_descriptor1->last_nongap,    sequence_descriptor2->last_nongap),
                    span_start   = MAX  (sequence_descriptor1->resolved_start, sequence_descriptor2->resolved_start),
                    span_end     = MIN  (sequence_descriptor1->resolved_end,    sequence_descriptor2->resolved_end);
//#pragma omp critical      
//      cout << first_nongap << " " << last_nongap << " " << span_start << " " << span_end << endl;
      
      
      if (span_start > span_end) {
        for (unsigned p = first_nongap; p <= last_nongap; p++) {
          unsigned c1 = s1[p],
                   c2 = s2[p];
          
          if (c1 < 4 && c2 < 4) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }
      }
      else {
        
        /*for (unsigned long p = first_nongap; p < span_start; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
          
          if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }*/
        unsigned long p = first_nongap;
          
        for (; p + 2 <= span_start; p+=2) {
            unsigned c1 = s1[p],   c2 = s2[p];
            unsigned c3 = s1[p+1], c4 = s2[p+1];
            
            if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
              integer_counts [c1][c2] ++;
            } else { // not both resolved
              if (c1 != GAP && c2 != GAP) {
                ambiguityHandler (c1,c2);
              }
            }
            
            if (__builtin_expect(c3 < 4 && c4 < 4, 1)) {
              integer_counts2 [c3][c4] ++;
            } else { // not both resolved
              if (c3 != GAP && c4 != GAP) {
                ambiguityHandler (c3,c4);
              }
            }
        }
          
        if (p < span_start) {
            unsigned c1 = s1[p];
            unsigned c2 = s2[p];

            if (__builtin_expect(c1 < 4 && c2 < 4, 1)) {
              integer_counts [c1][c2] ++;
            } else { // not both resolved
              if (c1 != GAP && c2 != GAP) {
                  ambiguityHandler (c1,c2);
              }
            }
          
        }
        
        // manual loop unroll here, use integer table counts
          
        //long equals [4] = {0L,0L,0L,0L};
          
          p  = span_start;
          for (; p + 2 <= span_end ; p+=2) {
              integer_counts  [s1[p]]   [s2[p]]   ++;
              integer_counts2 [s1[p+1]] [s2[p+1]] ++;
          }
              
          for (; p <= span_end ; p++) {
           integer_counts [(unsigned)s1[p]][(unsigned)s2[p]] ++;
         }

        /*for (unsigned long p = span_start; p <= span_end ; p++) {
            unsigned  idx1 = ((unsigned)s1[p]);
            unsigned  idx2 = ((unsigned)s2[p]);
            integer_counts [idx1][idx2] ++;
        }*/
          
        for (unsigned long p = span_end + 1UL; p <= last_nongap; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
 
          if (__builtin_expect(c1 < 4UL && c2 < 4UL,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              continue;
            }
            ambiguityHandler (c1,c2);
          }
        }
      }
    } else {
        for (unsigned p = 0; p < L; p++) {
          unsigned c1 = s1[p], c2 = s2[p];
          
          if (__builtin_expect(c1 < 4 && c2 < 4,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              if (matchMode != GAPMM) {
                continue;
              } else {
                if (c1 == GAP && c2 == GAP)
                  continue;
                else {
                  if (c1 == GAP) {
                    c1 = N_CHAR;
                  } else {
                    c2 = N_CHAR;
                  }
                }
              }
            }
            
            ambiguityHandler (c1,c2);
          }
        }
    }
  } else {
        for (unsigned p = 0; p < L; p++) {
          long pi = randomize[p];
          unsigned c1 = s1[pi], c2 = s2[pi];
          
          if (__builtin_expect(c1 < 4 && c2 < 4,1)) {
            integer_counts [c1][c2] ++;
          } else { // not both resolved
            if (c1 == GAP || c2 == GAP) {
              if (matchMode != GAPMM) {
                continue;
              } else {
                if (c1 == GAP && c2 == GAP)
                  continue;
                else {
                  if (c1 == GAP) {
                    c1 = N_CHAR;
                  } else {
                    c2 = N_CHAR;
                  }
                }
              }
            }
            
            ambiguityHandler (c1,c2);
          }
        }
  }
  
  
  //printf ("\n");
  for (int c1 = 0; c1 < 4; c1++) {
    //printf ("\n");
    for (int c2 = 0; c2 < 4; c2++) {
      double pc = (float_counts[c1][c2] += (double)(integer_counts[c1][c2] + integer_counts2[c1][c2]));
      //printf ("%12.2g\t", pc);
      totalNonGap   += pc;
      nucFreq [c1]  += pc;
      nucFreq [c2]  += pc;
    }
  }
  //printf ("\ntotalNonGap = %g\n", totalNonGap);

  if (totalNonGap <= min_overlap) {
    return -1.;
  }
  
  if ((matchMode == RESOLVE || matchMode == SUBSET) && resolve_fraction < 1. && totalNonGap * resolve_fraction <= ambig_count) {
    //cout << ambig_count << "/" << totalNonGap << endl;
    return computeTN93 (s1, s2,  L, AVERAGE , randomize, min_overlap,
                       histogram, slice, hist_size, count1, count2);
  }
  
  totalNonGap = 2./(nucFreq[0] + nucFreq[1] + nucFreq[2] + nucFreq[3]);
  
  auxd = 1./(nucFreq[0] + nucFreq[1] + nucFreq[2] + nucFreq[3]);
  for (aux1 = 0; aux1 < 4; aux1++)
    nucF[aux1] = nucFreq[aux1]*auxd;
  
  fR = nucF[0]+nucF[2];
  fY = nucF[1]+nucF[3];
  
  if (nucFreq[0] == 0 || nucFreq[1] == 0 || nucFreq[2] == 0 || nucFreq[3] == 0) {
      useK2P = true;
  } else {
    K1 = 2.*nucF[0]*nucF[2]/fR;
    K2 = 2.*nucF[1]*nucF[3]/fY;
    K3 = 2.*(fR*fY - nucF[0]*nucF[2]*fY/fR - nucF[1]*nucF[3]*fR/fY);
  }
  
  AG = (float_counts[0][2] + float_counts[2][0] )*totalNonGap;
  CT = (float_counts[1][3] + float_counts[3][1])*totalNonGap;
  tv = 1.-((float_counts[0][0] + float_counts[1][1] + float_counts[2][2] + float_counts[3][3])*totalNonGap +
           AG+CT);
  
  
  double dist;
  
  
  if (useK2P) {
    ti = AG+CT;
    AG = 1.-2.*ti-tv;
    CT = 1.-2.*tv;
    if (AG > 0. && CT > 0.)
      dist = -0.5*log(AG)-0.25*log(CT);
    else  
      dist = TN93_MAX_DIST;
  } else {
    AG	= 1.-AG/K1 - 0.5*tv/fR;
    CT	= 1.-CT/K2 - 0.5*tv/fY;
    tv  = 1.-0.5 * tv/fY/fR;
    if (AG > 0. && CT > 0. && tv > 0)
      dist = - K1*log(AG) - K2*log(CT) - K3*log (tv);
    else
      dist = TN93_MAX_DIST;
  }
  
  if (histogram) {
    long index = floor(dist * slice);
    if (index >= hist_size) {
      index = hist_size - 1;
    }
    histogram[index] += count1 * count2;
  }
  
  return dist <= 0. ? 0. : dist; // this is to avoid returning -0
}